

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libsboxd.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  pointer this;
  unique_ptr<Daemon,_std::default_delete<Daemon>_> local_20;
  char **local_18;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_18 = argv;
  argv_local._0_4_ = argc;
  if (argc == 2) {
    iVar1 = strcmp(argv[1],"stop");
    if (iVar1 == 0) {
      iVar1 = system("(cat /run/libsboxd.pid | xargs kill -s SIGTERM); rm /run/libsboxd.pid");
      _exit(iVar1);
    }
  }
  if ((int)argv_local == 2) {
    iVar1 = strcmp(local_18[1],"kill");
    if (iVar1 == 0) {
      iVar1 = system("(cat /run/libsboxd.pid | xargs kill -s SIGKILL); rm /run/libsboxd.pid");
      _exit(iVar1);
    }
  }
  if ((int)argv_local == 2) {
    iVar1 = strcmp(local_18[1],"killall");
    if (iVar1 == 0) {
      iVar1 = system("rm /run/libsboxd.pid; killall libsboxd -s SIGKILL");
      _exit(iVar1);
    }
  }
  std::make_unique<Daemon>();
  this = std::unique_ptr<Daemon,_std::default_delete<Daemon>_>::operator->(&local_20);
  Daemon::run(this);
}

Assistant:

int main(int argc, char *argv[]) {
    if (argc == 2 && strcmp(argv[1], "stop") == 0) {
        _exit(system("(cat /run/libsboxd.pid | xargs kill -s SIGTERM); rm /run/libsboxd.pid"));
    }
    if (argc == 2 && strcmp(argv[1], "kill") == 0) {
        _exit(system("(cat /run/libsboxd.pid | xargs kill -s SIGKILL); rm /run/libsboxd.pid"));
    }
    if (argc == 2 && strcmp(argv[1], "killall") == 0) {
        _exit(system("rm /run/libsboxd.pid; killall libsboxd -s SIGKILL"));
    }

    std::make_unique<Daemon>()->run();
}